

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall
fizplex::LPTestEmptyLP_ColumnAndRowCount_Test::TestBody(LPTestEmptyLP_ColumnAndRowCount_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  LP *this_00;
  char *in_R9;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  LP lp;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  AssertionResult *in_stack_fffffffffffffeb0;
  string local_130 [16];
  undefined8 in_stack_fffffffffffffee0;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_f9;
  AssertionResult local_f8;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0 [3];
  undefined1 local_a1;
  AssertionResult local_a0 [10];
  
  LP::LP((LP *)in_stack_fffffffffffffee0);
  sVar2 = LP::column_count((LP *)0x1c813b);
  local_a1 = sVar2 == 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffeb0,
             (bool *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),(type *)0x1c816b)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)local_a0,(AssertionResult *)"lp.column_count() == 0","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::Message::~Message((Message *)0x1c8261);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c82d6);
  this_00 = (LP *)LP::row_count((LP *)0x1c82e3);
  local_f9 = this_00 == (LP *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,
             (bool *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),(type *)0x1c830a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_130,(internal *)&local_f8,(AssertionResult *)"lp.row_count() == 0",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string(local_130);
    testing::Message::~Message((Message *)0x1c83e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c844d);
  LP::~LP(this_00);
  return;
}

Assistant:

TEST(LPTestEmptyLP, ColumnAndRowCount) {
  LP lp;
  EXPECT_TRUE(lp.column_count() == 0);
  EXPECT_TRUE(lp.row_count() == 0);
}